

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O1

void __thiscall higan::MultiplexEpoll::~MultiplexEpoll(MultiplexEpoll *this)

{
  pointer peVar1;
  
  (this->super_MultiplexBase)._vptr_MultiplexBase = (_func_int **)&PTR_UpdateChannel_00132ba8;
  close(this->epollfd_);
  peVar1 = (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1,(long)(this->epoll_events_).
                                 super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)peVar1);
  }
  MultiplexBase::~MultiplexBase(&this->super_MultiplexBase);
  return;
}

Assistant:

MultiplexEpoll::~MultiplexEpoll()
{
	close(epollfd_);
}